

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::UpdateMouseMovingWindowEndFrame(void)

{
  ImGuiWindow *pIVar1;
  undefined1 auVar2 [16];
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiWindow *pIVar5;
  ulong uVar6;
  undefined1 in_ZMM0 [64];
  undefined1 auVar7 [64];
  undefined8 in_XMM1_Qb;
  ImRect IVar9;
  ImRect local_18;
  undefined1 auVar8 [56];
  
  pIVar3 = GImGui;
  auVar8 = in_ZMM0._8_56_;
  if (((GImGui->ActiveId == 0) && (GImGui->HoveredId == 0)) &&
     ((pIVar5 = GImGui->NavWindow, pIVar5 == (ImGuiWindow *)0x0 || (pIVar5->Appearing == false)))) {
    if ((GImGui->IO).MouseClicked[0] == true) {
      if (GImGui->HoveredRootWindow == (ImGuiWindow *)0x0) {
        if (pIVar5 != (ImGuiWindow *)0x0) {
          pIVar5 = GetTopMostPopupModal();
          if (pIVar5 == (ImGuiWindow *)0x0) {
            FocusWindow((ImGuiWindow *)0x0);
          }
        }
      }
      else {
        StartMouseMovingWindow(GImGui->HoveredWindow);
        if (((pIVar3->IO).ConfigWindowsMoveFromTitleBarOnly == true) &&
           ((pIVar3->HoveredRootWindow->Flags & 1) == 0)) {
          IVar9 = ImGuiWindow::TitleBarRect(pIVar3->HoveredRootWindow);
          auVar7._0_8_ = IVar9.Min;
          auVar7._8_56_ = auVar8;
          auVar2._8_8_ = in_XMM1_Qb;
          auVar2._0_4_ = IVar9.Max.x;
          auVar2._4_4_ = IVar9.Max.y;
          local_18 = (ImRect)vmovlhps_avx(auVar7._0_16_,auVar2);
          bVar4 = ImRect::Contains(&local_18,(pIVar3->IO).MouseClickedPos);
          if (!bVar4) {
            pIVar3->MovingWindow = (ImGuiWindow *)0x0;
          }
        }
      }
    }
    if ((pIVar3->IO).MouseClicked[1] == true) {
      pIVar5 = GetTopMostPopupModal();
      bVar4 = pIVar5 == (ImGuiWindow *)0x0;
      for (uVar6 = (ulong)(uint)(pIVar3->Windows).Size;
          ((0 < (int)uVar6 && (!bVar4)) &&
          (pIVar1 = (pIVar3->Windows).Data[uVar6 - 1], pIVar1 != pIVar5)); uVar6 = uVar6 - 1) {
        if (pIVar1 == pIVar3->HoveredWindow) {
          bVar4 = true;
        }
      }
      if (bVar4) {
        pIVar5 = pIVar3->HoveredWindow;
      }
      ClosePopupsOverWindow(pIVar5,true);
    }
  }
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowEndFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.ActiveId != 0 || g.HoveredId != 0)
        return;

    // Unless we just made a window/popup appear
    if (g.NavWindow && g.NavWindow->Appearing)
        return;

    // Click to focus window and start moving (after we're done with all our widgets)
    if (g.IO.MouseClicked[0])
    {
        if (g.HoveredRootWindow != NULL)
        {
            StartMouseMovingWindow(g.HoveredWindow);
            if (g.IO.ConfigWindowsMoveFromTitleBarOnly && !(g.HoveredRootWindow->Flags & ImGuiWindowFlags_NoTitleBar))
                if (!g.HoveredRootWindow->TitleBarRect().Contains(g.IO.MouseClickedPos[0]))
                    g.MovingWindow = NULL;
        }
        else if (g.NavWindow != NULL && GetTopMostPopupModal() == NULL)
        {
            // Clicking on void disable focus
            FocusWindow(NULL);
        }
    }

    // With right mouse button we close popups without changing focus based on where the mouse is aimed
    // Instead, focus will be restored to the window under the bottom-most closed popup.
    // (The left mouse button path calls FocusWindow on the hovered window, which will lead NewFrame->ClosePopupsOverWindow to trigger)
    if (g.IO.MouseClicked[1])
    {
        // Find the top-most window between HoveredWindow and the top-most Modal Window.
        // This is where we can trim the popup stack.
        ImGuiWindow* modal = GetTopMostPopupModal();
        bool hovered_window_above_modal = false;
        if (modal == NULL)
            hovered_window_above_modal = true;
        for (int i = g.Windows.Size - 1; i >= 0 && hovered_window_above_modal == false; i--)
        {
            ImGuiWindow* window = g.Windows[i];
            if (window == modal)
                break;
            if (window == g.HoveredWindow)
                hovered_window_above_modal = true;
        }
        ClosePopupsOverWindow(hovered_window_above_modal ? g.HoveredWindow : modal, true);
    }
}